

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

PHYSFS_EnumerateCallbackResult enumCallbackFilterSymLinks(void *_data,char *origdir,char *fname)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  code *pcVar3;
  undefined8 uVar4;
  int iVar5;
  PHYSFS_EnumerateCallbackResult PVar6;
  size_t sVar7;
  size_t sVar8;
  long *plVar9;
  long lVar10;
  ErrState *pEVar11;
  PHYSFS_ErrorCode PVar12;
  long *plVar13;
  char *pcVar14;
  void **retval;
  char *__s;
  ulong __maxlen;
  long lStack_78;
  undefined1 local_70 [8];
  PHYSFS_Stat statbuf;
  
  plVar13 = &lStack_78;
  puVar1 = *(undefined8 **)((long)_data + 0x10);
  __s = *(char **)((long)_data + 0x18) + (**(char **)((long)_data + 0x18) == '/');
  sVar7 = strlen(__s);
  statbuf._32_8_ = fname;
  sVar8 = strlen(fname);
  __maxlen = sVar7 + sVar8 + 2;
  if (__maxlen < 0x100) {
    plVar13 = (long *)((long)&lStack_78 - (sVar8 + sVar7 + 0x19 & 0xfffffffffffffff0));
    lVar10 = 0;
    plVar9 = plVar13;
  }
  else {
    plVar9 = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar8 + sVar7 + 10);
    if (plVar9 == (long *)0x0) {
      *(undefined4 *)((long)_data + 0x20) = 2;
      return PHYSFS_ENUM_ERROR;
    }
    lVar10 = 1;
  }
  *plVar9 = lVar10;
  uVar4 = statbuf._32_8_;
  pcVar14 = "/";
  if (*__s == '\0') {
    pcVar14 = "";
  }
  plVar13[-1] = 0x109263;
  snprintf((char *)(plVar9 + 1),__maxlen,"%s%s%s",__s,pcVar14,uVar4);
  uVar2 = *puVar1;
  pcVar3 = *(code **)(puVar1[5] + 0x68);
  plVar13[-1] = 0x109278;
  iVar5 = (*pcVar3)(uVar2,plVar9 + 1,local_70);
  if (iVar5 == 0) {
    plVar13[-1] = 0x1092a9;
    pEVar11 = findErrorForCurrentThread();
    PVar12 = PHYSFS_ERR_OK;
    if (pEVar11 != (ErrState *)0x0) {
      PVar12 = pEVar11->code;
    }
  }
  else {
    PVar6 = PHYSFS_ENUM_OK;
    if ((int)statbuf.accesstime == 2) goto LAB_001092bf;
    uVar2 = *(undefined8 *)((long)_data + 8);
    pcVar3 = *_data;
    plVar13[-1] = 0x109295;
    PVar6 = (*pcVar3)(uVar2,origdir,uVar4);
    if (PVar6 != PHYSFS_ENUM_ERROR) goto LAB_001092bf;
    PVar12 = PHYSFS_ERR_APP_CALLBACK;
  }
  *(PHYSFS_ErrorCode *)((long)_data + 0x20) = PVar12;
  PVar6 = PHYSFS_ENUM_ERROR;
LAB_001092bf:
  if (*plVar9 != 0) {
    plVar13[-1] = 0x1092cf;
    (*__PHYSFS_AllocatorHooks.Free)(plVar9);
  }
  return PVar6;
}

Assistant:

static PHYSFS_EnumerateCallbackResult enumCallbackFilterSymLinks(void *_data,
                                    const char *origdir, const char *fname)
{
    SymlinkFilterData *data = (SymlinkFilterData *) _data;
    const DirHandle *dh = data->dirhandle;
    const char *arcfname = data->arcfname;
    PHYSFS_Stat statbuf;
    const char *trimmedDir = (*arcfname == '/') ? (arcfname + 1) : arcfname;
    const size_t slen = strlen(trimmedDir) + strlen(fname) + 2;
    char *path = (char *) __PHYSFS_smallAlloc(slen);
    PHYSFS_EnumerateCallbackResult retval = PHYSFS_ENUM_OK;

    if (path == NULL)
    {
        data->errcode = PHYSFS_ERR_OUT_OF_MEMORY;
        return PHYSFS_ENUM_ERROR;
    } /* if */

    snprintf(path, slen, "%s%s%s", trimmedDir, *trimmedDir ? "/" : "", fname);

    if (!dh->funcs->stat(dh->opaque, path, &statbuf))
    {
        data->errcode = currentErrorCode();
        retval = PHYSFS_ENUM_ERROR;
    } /* if */
    else
    {
        /* Pass it on to the application if it's not a symlink. */
        if (statbuf.filetype != PHYSFS_FILETYPE_SYMLINK)
        {
            retval = data->callback(data->callbackData, origdir, fname);
            if (retval == PHYSFS_ENUM_ERROR)
                data->errcode = PHYSFS_ERR_APP_CALLBACK;
        } /* if */
    } /* else */

    __PHYSFS_smallFree(path);

    return retval;
}